

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yy_block(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yypos887;
  int yythunkpos887;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,1,0,"yyPush");
  yyDo(G,yy_1_block,G->begin,G->end,"yy_1_block");
  iVar4 = yymatchChar(G,0x7b);
  if (iVar4 != 0) {
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yy_ws(G);
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar5 = yy_statementlist(G);
    if (iVar5 == 0) {
      G->pos = iVar4;
      G->thunkpos = iVar3;
    }
    else {
      yyDo(G,yySet,-1,0,"yySet");
    }
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yy_ws(G);
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar4 = yymatchChar(G,0x7d);
    if (iVar4 != 0) {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchChar(G,0x2e);
      if (iVar5 == 0) {
        G->pos = iVar4;
        G->thunkpos = iVar3;
        yyDo(G,yy_2_block,G->begin,G->end,"yy_2_block");
        yyDo(G,yyPop,1,0,"yyPop");
        return 1;
      }
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_block(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 1, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "block"));
  yyDo(G, yy_1_block, G->begin, G->end, "yy_1_block");
  if (!yymatchChar(G, '{')) goto l886;
  if (!yy__(G))  goto l886;

  {  int yypos887= G->pos, yythunkpos887= G->thunkpos;  if (!yy_statementlist(G))  goto l887;
  yyDo(G, yySet, -1, 0, "yySet");
  goto l888;
  l887:;	  G->pos= yypos887; G->thunkpos= yythunkpos887;
  }
  l888:;	  if (!yy__(G))  goto l886;
  if (!yymatchChar(G, '}')) goto l886;

  {  int yypos889= G->pos, yythunkpos889= G->thunkpos;  if (!yymatchChar(G, '.')) goto l889;
  goto l886;
  l889:;	  G->pos= yypos889; G->thunkpos= yythunkpos889;
  }  yyDo(G, yy_2_block, G->begin, G->end, "yy_2_block");
  yyprintf((stderr, "  ok   block"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 1, 0, "yyPop");
  return 1;
  l886:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "block"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}